

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qframe.cpp
# Opt level: O2

void __thiscall QFramePrivate::updateFrameWidth(QFramePrivate *this)

{
  QFrame *this_00;
  long in_FS_OFFSET;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFrame **)&(this->super_QWidgetPrivate).field_0x8;
  local_30 = QFrame::frameRect(this_00);
  updateStyledFrameWidths(this);
  QFrame::setFrameRect(this_00,&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QWidgetPrivate::setLayoutItemMargins
              (&this->super_QWidgetPrivate,SE_FrameLayoutItem,(QStyleOption *)0x0);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFramePrivate::updateFrameWidth()
{
    Q_Q(QFrame);
    QRect fr = q->frameRect();
    updateStyledFrameWidths();
    q->setFrameRect(fr);
    setLayoutItemMargins(QStyle::SE_FrameLayoutItem);
}